

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QWidget * __thiscall
QAbstractItemViewPrivate::editor
          (QAbstractItemViewPrivate *this,QModelIndex *index,QStyleOptionViewItem *options)

{
  long lVar1;
  QAbstractItemView *pQVar2;
  QWidget *pQVar3;
  QWidget *first;
  QWidget *pQVar4;
  offset_in_QAbstractItemView_to_subr *in_RDX;
  ContextType *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  ConnectionType in_stack_00000010;
  QAbstractItemDelegate *delegate;
  QWidget *w;
  QAbstractItemView *q;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff98;
  code *editor;
  QAbstractItemViewPrivate *this_00;
  QAbstractItemViewPrivate *index_00;
  QAbstractItemViewPrivate *in_stack_ffffffffffffffd8;
  Connection in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = in_RDI;
  pQVar2 = q_func(in_RDI);
  editorForIndex(in_stack_ffffffffffffff98,(QModelIndex *)in_RDI);
  pQVar3 = QPointer<QWidget>::data((QPointer<QWidget> *)0x80cd06);
  if (pQVar3 == (QWidget *)0x0) {
    first = (QWidget *)
            (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                        0x208))(pQVar2,in_RSI);
    if (first == (QWidget *)0x0) {
      pQVar3 = (QWidget *)0x0;
    }
    else {
      pQVar3 = (QWidget *)
               (**(code **)(*(long *)first + 0x70))
                         (first,(in_RDI->super_QAbstractScrollAreaPrivate).viewport,in_RDX,in_RSI);
      if (pQVar3 != (QWidget *)0x0) {
        QObject::installEventFilter((QObject *)pQVar3);
        editor = QObject::destroyed;
        this_00 = (QAbstractItemViewPrivate *)0x0;
        QObject::connect<void(QObject::*)(QObject*),void(QAbstractItemView::*)(QObject*)>
                  ((Object *)index_00,(offset_in_QObject_to_subr)in_stack_fffffffffffffff0.d_ptr,
                   in_RSI,in_RDX,in_stack_00000010);
        QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
        (**(code **)(*(long *)first + 0x90))(first,pQVar3,in_RDX,in_RSI);
        (**(code **)(*(long *)first + 0x80))(first,pQVar3,in_RSI);
        addEditor(in_stack_ffffffffffffffd8,(QModelIndex *)index_00,
                  (QWidget *)in_stack_fffffffffffffff0.d_ptr,SUB81((ulong)in_RSI >> 0x38,0));
        pQVar4 = (QWidget *)QObject::parent((QObject *)0x80ce38);
        if (pQVar4 == (in_RDI->super_QAbstractScrollAreaPrivate).viewport) {
          QWidget::setTabOrder(first,(QWidget *)this_00);
        }
        selectAllInEditor(this_00,(QWidget *)editor);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QWidget *QAbstractItemViewPrivate::editor(const QModelIndex &index,
                                          const QStyleOptionViewItem &options)
{
    Q_Q(QAbstractItemView);
    QWidget *w = editorForIndex(index).widget.data();
    if (!w) {
        QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        if (!delegate)
            return nullptr;
        w = delegate->createEditor(viewport, options, index);
        if (w) {
            w->installEventFilter(delegate);
            QObject::connect(w, &QWidget::destroyed, q, &QAbstractItemView::editorDestroyed);
            delegate->updateEditorGeometry(w, options, index);
            delegate->setEditorData(w, index);
            addEditor(index, w, false);
            if (w->parent() == viewport)
                QWidget::setTabOrder(q, w);

            selectAllInEditor(w);
        }
    }

    return w;
}